

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O0

int __thiscall http::Page::Printf(Page *this,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_2f8 [16];
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined4 local_238;
  int rc;
  va_list vlist;
  char local_218 [4];
  int i;
  char buffer [512];
  char *format_local;
  Page *this_local;
  
  if (in_AL != '\0') {
    local_2c8 = in_XMM0_Qa;
    local_2b8 = in_XMM1_Qa;
    local_2a8 = in_XMM2_Qa;
    local_298 = in_XMM3_Qa;
    local_288 = in_XMM4_Qa;
    local_278 = in_XMM5_Qa;
    local_268 = in_XMM6_Qa;
    local_258 = in_XMM7_Qa;
  }
  vlist[0].overflow_arg_area = local_2f8;
  vlist[0]._0_8_ = &stack0x00000008;
  rc = 0x30;
  local_238 = 0x10;
  local_2e8 = in_RDX;
  local_2e0 = in_RCX;
  local_2d8 = in_R8;
  local_2d0 = in_R9;
  buffer._504_8_ = format;
  vsnprintf(local_218,0x200,format,&local_238);
  for (vlist[0].reg_save_area._4_4_ = 0;
      local_218[vlist[0].reg_save_area._4_4_] != '\0' && vlist[0].reg_save_area._4_4_ < 0x1ff;
      vlist[0].reg_save_area._4_4_ = vlist[0].reg_save_area._4_4_ + 1) {
    RawSend(this,local_218 + vlist[0].reg_save_area._4_4_,1);
  }
  return vlist[0].reg_save_area._4_4_;
}

Assistant:

int http::Page::Printf(const char* format, ...)
{
    char buffer[BUFFER_SIZE];
    int i;
    va_list vlist;
    int rc;

    va_start(vlist, format);

    vsnprintf(buffer, sizeof(buffer), format, vlist);

    for (i = 0; buffer[i] && i < (int)(sizeof(buffer) - 1); i++)
    {
        RawSend(&buffer[i], 1);
    }
    rc = i;

    return rc;
}